

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

size_t Pass3::adjust_index(vector<const_Type_*,_std::allocator<const_Type_*>_> *types,
                          size_t old_index)

{
  bool bVar1;
  size_t i;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 0;
  for (sVar2 = 0; old_index != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = is_empty_tuple((types->super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[sVar2]);
    sVar3 = sVar3 + !bVar1;
  }
  return sVar3;
}

Assistant:

static std::size_t adjust_index(const std::vector<const Type*>& types, std::size_t old_index) {
		std::size_t new_index = 0;
		for (std::size_t i = 0; i < old_index; ++i) {
			if (!is_empty_tuple(types[i])) {
				++new_index;
			}
		}
		return new_index;
	}